

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_error adios2_clear_parameters(adios2_io *io)

{
  allocator local_48 [32];
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,"for adios2_io, in call to adios2_clear_parameters",local_48);
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  adios2::core::IO::ClearParameters();
  return adios2_error_none;
}

Assistant:

adios2_error adios2_clear_parameters(adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_clear_parameters");
        reinterpret_cast<adios2::core::IO *>(io)->ClearParameters();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_clear_parameters"));
    }
}